

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O3

int xmlTextWriterStartPI(xmlTextWriterPtr writer,xmlChar *target)

{
  int iVar1;
  int iVar2;
  int iVar3;
  xmlLinkPtr lk;
  void *pvVar4;
  undefined8 *data;
  xmlChar *pxVar5;
  char *msg;
  xmlParserErrors error;
  
  if (target == (xmlChar *)0x0 || writer == (xmlTextWriterPtr)0x0) {
    return -1;
  }
  if (*target == '\0') {
    return -1;
  }
  iVar1 = xmlStrcasecmp(target,"xml");
  if (iVar1 == 0) {
    msg = "xmlTextWriterStartPI : target name [Xx][Mm][Ll] is reserved for xml standardization!\n";
LAB_001d2eaf:
    error = XML_ERR_INTERNAL_ERROR;
  }
  else {
    lk = xmlListFront(writer->nodes);
    iVar1 = 0;
    if ((lk != (xmlLinkPtr)0x0) && (pvVar4 = xmlLinkGetData(lk), iVar1 = 0, pvVar4 != (void *)0x0))
    {
      iVar2 = 0;
      iVar1 = 0;
      switch(*(undefined4 *)((long)pvVar4 + 8)) {
      case 0:
      case 3:
      case 7:
        break;
      case 2:
        iVar2 = xmlTextWriterEndAttribute(writer);
        if (iVar2 < 0) {
          return -1;
        }
      case 1:
        iVar3 = xmlTextWriterOutputNSDecl(writer);
        if (iVar3 < 0) {
          return -1;
        }
        iVar1 = xmlOutputBufferWriteString(writer->out,">");
        if (iVar1 < 0) {
          return -1;
        }
        iVar1 = iVar3 + iVar2 + iVar1;
        *(undefined4 *)((long)pvVar4 + 8) = 3;
        break;
      case 4:
      case 5:
        msg = "xmlTextWriterStartPI : nested PI!\n";
        goto LAB_001d2eaf;
      default:
        goto switchD_001d2e39_caseD_6;
      }
    }
    data = (undefined8 *)(*xmlMalloc)(0x10);
    if (data != (undefined8 *)0x0) {
      pxVar5 = xmlStrdup(target);
      *data = pxVar5;
      if (pxVar5 == (xmlChar *)0x0) {
        xmlWriterErrMsg(writer,XML_ERR_NO_MEMORY,"xmlTextWriterStartPI : out of memory!\n");
        (*xmlFree)(data);
        return -1;
      }
      *(undefined4 *)(data + 1) = 4;
      xmlListPushFront(writer->nodes,data);
      iVar2 = xmlOutputBufferWriteString(writer->out,"<?");
      if (iVar2 < 0) {
        return -1;
      }
      iVar3 = xmlOutputBufferWriteString(writer->out,(char *)*data);
      if (iVar3 < 0) {
        return -1;
      }
      return iVar2 + iVar1 + iVar3;
    }
    msg = "xmlTextWriterStartPI : out of memory!\n";
    error = XML_ERR_NO_MEMORY;
  }
  xmlWriterErrMsg(writer,error,msg);
switchD_001d2e39_caseD_6:
  return -1;
}

Assistant:

int
xmlTextWriterStartPI(xmlTextWriterPtr writer, const xmlChar * target)
{
    int count;
    int sum;
    xmlLinkPtr lk;
    xmlTextWriterStackEntry *p;

    if ((writer == NULL) || (target == NULL) || (*target == '\0'))
        return -1;

    if (xmlStrcasecmp(target, (const xmlChar *) "xml") == 0) {
        xmlWriterErrMsg(writer, XML_ERR_INTERNAL_ERROR,
                        "xmlTextWriterStartPI : target name [Xx][Mm][Ll] is reserved for xml standardization!\n");
        return -1;
    }

    sum = 0;
    lk = xmlListFront(writer->nodes);
    if (lk != 0) {
        p = (xmlTextWriterStackEntry *) xmlLinkGetData(lk);
        if (p != 0) {
            switch (p->state) {
                case XML_TEXTWRITER_ATTRIBUTE:
                    count = xmlTextWriterEndAttribute(writer);
                    if (count < 0)
                        return -1;
                    sum += count;
                    /* fallthrough */
                case XML_TEXTWRITER_NAME:
                    /* Output namespace declarations */
                    count = xmlTextWriterOutputNSDecl(writer);
                    if (count < 0)
                        return -1;
                    sum += count;
                    count = xmlOutputBufferWriteString(writer->out, ">");
                    if (count < 0)
                        return -1;
                    sum += count;
                    p->state = XML_TEXTWRITER_TEXT;
                    break;
                case XML_TEXTWRITER_NONE:
                case XML_TEXTWRITER_TEXT:
                case XML_TEXTWRITER_DTD:
                    break;
                case XML_TEXTWRITER_PI:
                case XML_TEXTWRITER_PI_TEXT:
                    xmlWriterErrMsg(writer, XML_ERR_INTERNAL_ERROR,
                                    "xmlTextWriterStartPI : nested PI!\n");
                    return -1;
                default:
                    return -1;
            }
        }
    }

    p = (xmlTextWriterStackEntry *)
        xmlMalloc(sizeof(xmlTextWriterStackEntry));
    if (p == 0) {
        xmlWriterErrMsg(writer, XML_ERR_NO_MEMORY,
                        "xmlTextWriterStartPI : out of memory!\n");
        return -1;
    }

    p->name = xmlStrdup(target);
    if (p->name == 0) {
        xmlWriterErrMsg(writer, XML_ERR_NO_MEMORY,
                        "xmlTextWriterStartPI : out of memory!\n");
        xmlFree(p);
        return -1;
    }
    p->state = XML_TEXTWRITER_PI;

    xmlListPushFront(writer->nodes, p);

    count = xmlOutputBufferWriteString(writer->out, "<?");
    if (count < 0)
        return -1;
    sum += count;
    count =
        xmlOutputBufferWriteString(writer->out, (const char *) p->name);
    if (count < 0)
        return -1;
    sum += count;

    return sum;
}